

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O0

Response * __thiscall
ot::commissioner::coap::Coap::ResponsesCache::Match(ResponsesCache *this,Request *aRequest)

{
  bool bVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  reference ppVar4;
  Message *this_00;
  Endpoint *pEVar5;
  Endpoint *pEVar6;
  Message *response;
  pair<const_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_ot::commissioner::coap::Message>
  *kv;
  const_iterator __end2;
  const_iterator __begin2;
  multimap<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_ot::commissioner::coap::Message,_std::less<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<const_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_ot::commissioner::coap::Message>_>_>
  *__range2;
  Request *aRequest_local;
  ResponsesCache *this_local;
  
  __end2 = std::
           multimap<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_ot::commissioner::coap::Message,_std::less<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<const_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_ot::commissioner::coap::Message>_>_>
           ::begin(&this->mContainer);
  kv = (pair<const_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_ot::commissioner::coap::Message>
        *)std::
          multimap<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_ot::commissioner::coap::Message,_std::less<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<const_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_ot::commissioner::coap::Message>_>_>
          ::end(&this->mContainer);
  do {
    bVar1 = std::operator!=(&__end2,(_Self *)&kv);
    if (!bVar1) {
      return (Response *)0x0;
    }
    ppVar4 = std::
             _Rb_tree_const_iterator<std::pair<const_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_ot::commissioner::coap::Message>_>
             ::operator*(&__end2);
    this_00 = &ppVar4->second;
    pEVar5 = Message::GetEndpoint(this_00);
    pEVar6 = Message::GetEndpoint(aRequest);
    if (pEVar5 == pEVar6) {
      uVar2 = Message::GetMessageId(this_00);
      uVar3 = Message::GetMessageId(aRequest);
      if (uVar2 == uVar3) {
        return this_00;
      }
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_ot::commissioner::coap::Message>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

const Response *Coap::ResponsesCache::Match(const Request &aRequest) const
{
    for (const auto &kv : mContainer)
    {
        const auto &response = kv.second;
        if (response.GetEndpoint() != aRequest.GetEndpoint())
        {
            continue;
        }
        if (response.GetMessageId() != aRequest.GetMessageId())
        {
            continue;
        }
        return &response;
    }
    return nullptr;
}